

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall Lib::Stack<unsigned_int>::reserve(Stack<unsigned_int> *this,size_t capacity)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->_capacity < capacity) {
    uVar4 = capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      puVar2 = (uint *)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar4 < 0x11) {
      puVar2 = (uint *)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
    }
    else if (uVar4 < 0x19) {
      puVar2 = (uint *)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
    }
    else if (uVar4 < 0x21) {
      puVar2 = (uint *)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
    }
    else if (uVar4 < 0x31) {
      puVar2 = (uint *)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
    }
    else if (uVar4 < 0x41) {
      puVar2 = (uint *)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
    }
    else {
      puVar2 = (uint *)::operator_new(uVar4,0x10);
    }
    puVar1 = this->_stack;
    if (puVar1 == (uint *)0x0) {
      this->_stack = puVar2;
      this->_cursor = puVar2;
      this->_capacity = capacity;
    }
    else {
      lVar3 = (long)this->_cursor - (long)puVar1;
      if (lVar3 != 0) {
        uVar4 = 0;
        do {
          puVar2[uVar4] = puVar1[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 2));
      }
      uVar4 = this->_capacity * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar1;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar1;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar1;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar1;
      }
      else if (uVar4 < 0x41) {
        *(undefined8 *)puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
      }
      else {
        operator_delete(puVar1,0x10);
      }
      this->_cursor = (uint *)(((long)this->_cursor - (long)this->_stack) + (long)puVar2);
      this->_capacity = capacity;
      this->_stack = puVar2;
    }
    this->_end = puVar2 + capacity;
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }